

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingBar::IfcReinforcingBar(IfcReinforcingBar *this)

{
  IfcReinforcingBar *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x208,"IfcReinforcingBar");
  Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
            (&this->super_IfcReinforcingElement,&PTR_construction_vtable_24__01083a50);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcReinforcingBar,_5UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcReinforcingBar,_5UL> *)
             &(this->super_IfcReinforcingElement).field_0x190,&PTR_construction_vtable_24__01083c30)
  ;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x10838d0;
  *(undefined8 *)&this->field_0x208 = 0x1083a38;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x10838f8;
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x1083920;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x1083948;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x1083970;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = 0x1083998;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x10839c0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    field_0x158 = 0x10839e8;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x190 = 0x1083a10;
  STEP::Maybe<double>::Maybe(&this->BarLength);
  std::__cxx11::string::string((string *)&this->BarRole);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->BarSurface);
  return;
}

Assistant:

IfcReinforcingBar() : Object("IfcReinforcingBar") {}